

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

parameter * __thiscall
clipp::required<char_const(&)[3],char_const(&)[12]>
          (parameter *__return_storage_ptr__,clipp *this,char (*flag) [3],char (*flags) [12])

{
  size_t sVar1;
  arg_string local_148;
  parameter local_128;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  sVar1 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,this,this + sVar1);
  parameter::parameter<char_const(&)[12]>(&local_128,&local_148,(char (*) [12])flag);
  local_128.required_ = true;
  local_128.super_token<clipp::parameter>.repeatable_ = false;
  local_128.super_token<clipp::parameter>.blocking_ = false;
  parameter::parameter(__return_storage_ptr__,&local_128);
  parameter::~parameter(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline parameter
required(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(true).blocking(false).repeatable(false);
}